

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::PathIntegrator::Li
          (PathIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *scratchBuffer,VisibleSurface *visibleSurface)

{
  Vector3f *pVVar1;
  undefined8 uVar2;
  uintptr_t uVar3;
  size_t sVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  LightSampleContext LVar8;
  LightSampleContext LVar9;
  LightSampleContext LVar10;
  LightSampleContext LVar11;
  undefined1 auVar12 [16];
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined8 uVar17;
  undefined8 uVar85;
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [24];
  undefined1 auVar21 [32];
  undefined1 auVar22 [24];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  SamplerHandle *pSVar25;
  int i;
  int iVar26;
  uint uVar27;
  BxDFFlags BVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  ExhaustiveLightSampler *pEVar32;
  DebugMLTSampler *this_00;
  pointer pLVar33;
  int iVar34;
  pointer pLVar35;
  ulong uVar36;
  long in_FS_OFFSET;
  bool bVar37;
  undefined1 auVar39 [16];
  undefined1 auVar42 [48];
  undefined1 auVar40 [64];
  float fVar43;
  float fVar44;
  float fVar45;
  Float FVar46;
  float fVar67;
  SampledSpectrum ret;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar68 [56];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar66 [64];
  undefined4 uVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  SampledSpectrum ret_4;
  undefined1 auVar81 [16];
  undefined1 in_XMM6 [16];
  SampledSpectrum SVar82;
  Vector3f woRender;
  Vector3f woRender_00;
  Vector3f wiRender;
  Float f;
  Float invBase;
  BSDFSample bs;
  SampledSpectrum ret_1;
  SampledSpectrum rrBeta;
  SampledSpectrum Le;
  BSDF bsdf;
  optional<pbrt::ShapeIntersection> si;
  uint local_480;
  float local_47c;
  float local_478;
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  DispatchSplit<5> local_439;
  RayDifferential *local_438;
  float local_430;
  undefined1 local_42c [4];
  undefined1 local_428 [12];
  float fStack_41c;
  undefined8 local_418;
  float local_410;
  float local_40c;
  BxDFFlags local_408;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  SamplerHandle *local_3d0;
  PathIntegrator *local_3c8;
  ulong local_3c0;
  TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_3b8;
  float local_3b0;
  undefined1 local_3a8 [32];
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  TStack_388;
  undefined8 uStack_380;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  float fStack_360;
  undefined8 uStack_35c;
  undefined8 uStack_354;
  undefined8 local_340;
  undefined1 local_338 [16];
  undefined1 local_328 [4];
  float afStack_324 [3];
  undefined1 local_318 [16];
  VisibleSurface *local_300;
  undefined1 local_2f8 [24];
  Tuple3<pbrt::Normal3,_float> local_2e0;
  Tuple3<pbrt::Normal3,_float> local_2d4 [2];
  Interval<float> local_2b8;
  Interval<float> IStack_2b0;
  Interval<float> IStack_2a8;
  undefined8 uStack_2a0;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  Interval<float> local_288;
  Interval<float> IStack_280;
  Interval<float> IStack_278;
  undefined8 uStack_270;
  float fStack_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  bool *local_248;
  ScratchBuffer *local_240;
  PrimitiveHandle *local_238;
  SamplerHandle local_230;
  SamplerHandle local_228;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_220;
  Interval<float> local_218;
  Interval<float> IStack_210;
  Interval<float> IStack_208;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  undefined1 local_1d8 [16];
  Float local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_1b8;
  ulong local_b8;
  undefined1 local_a8 [16];
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  Tuple3<pbrt::Normal3,_float> TStack_78;
  undefined4 uStack_6c;
  undefined1 auStack_68 [48];
  undefined1 auVar83 [28];
  undefined1 auVar84 [40];
  undefined1 auVar38 [16];
  undefined1 auVar41 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 auVar75 [64];
  undefined1 auVar80 [56];
  
  fStack_3f0 = 1.0;
  local_3f8 = (undefined1  [8])0x3f8000003f800000;
  fStack_3ec = 1.0;
  iVar34 = 0;
  local_340 = 0;
  local_480 = 0;
  local_218.low = 0.0;
  local_218.high = 0.0;
  IStack_210.low = 0.0;
  IStack_210.high = 0.0;
  IStack_208.low = 0.0;
  IStack_208.high = 0.0;
  uStack_200 = 0;
  uStack_1fc = 0;
  uStack_1f8 = 0;
  uStack_1f4 = 0;
  fStack_1f0 = 0.0;
  fStack_1ec = 0.0;
  fStack_1e8 = 0.0;
  uStack_1e4 = 0;
  uStack_1e0 = 0;
  local_238 = &(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.aggregate;
  local_a8._0_4_ = 0.0;
  local_a8._4_4_ = 0.0;
  local_a8._8_8_ = 0;
  uStack_98 = 0;
  uStack_90 = 0;
  uStack_88 = 0;
  uStack_80 = 0;
  TStack_78.z = 0.0;
  uStack_6c = 0;
  auStack_68 = (undefined1  [48])0x0;
  local_248 = &ray->hasDifferentials;
  local_1d8 = SUB6416(ZEXT464(0x3f800000),0);
  local_430 = 0.2;
  _local_3e8 = ZEXT816(0);
  local_438 = ray;
  local_3d0 = sampler;
  local_3c8 = this;
  local_300 = visibleSurface;
  local_240 = scratchBuffer;
  TStack_78._0_8_ = local_a8._0_8_;
  do {
    *(long *)(in_FS_OFFSET + -0x2d8) = *(long *)(in_FS_OFFSET + -0x2d8) + 1;
    iVar26 = iVar34;
    if (((local_238->
         super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
         ).bits & 0xffffffffffff) == 0) {
      local_1b8._0_64_ = ZEXT1664(ZEXT816(0) << 0x40);
      local_b8 = 0;
      local_1b8._64_64_ = local_1b8._0_64_;
      local_1b8._128_64_ = local_1b8._0_64_;
      local_1b8._192_64_ = local_1b8._0_64_;
LAB_0042c603:
      pLVar35 = (this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                infiniteLights.
                super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
                super__Vector_impl_data._M_start;
      pLVar33 = *(pointer *)
                 ((long)&(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                         infiniteLights.
                         super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                         _M_impl.super__Vector_impl_data + 8);
      bVar37 = true;
      this = local_3c8;
      if (pLVar35 != pLVar33) {
        local_338._0_8_ = pLVar33;
        local_318._0_4_ = local_47c * local_47c;
        do {
          uVar29 = (pLVar35->
                   super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                   ).bits;
          auVar38 = ZEXT816(0) << 0x40;
          auVar71 = ZEXT816(0) << 0x40;
          uVar27 = (uint)(ushort)(uVar29 >> 0x30);
          if (6 < uVar27) {
            uVar27 = uVar27 - 6;
            if (uVar27 < 2) {
              auVar68 = ZEXT856(0);
              auVar80 = ZEXT856(0);
              SVar82 = UniformInfiniteLight::Le
                                 ((UniformInfiniteLight *)(uVar29 & 0xffffffffffff),
                                  &local_438->super_Ray,lambda);
              auVar76._0_8_ = SVar82.values.values._8_8_;
              auVar76._8_56_ = auVar80;
              auVar71 = auVar76._0_16_;
              auVar54._0_8_ = SVar82.values.values._0_8_;
              auVar54._8_56_ = auVar68;
              auVar38 = auVar54._0_16_;
            }
            else if (uVar27 == 2) {
              auVar68 = ZEXT856(0);
              auVar80 = ZEXT856(0);
              SVar82 = ImageInfiniteLight::Le
                                 ((ImageInfiniteLight *)(uVar29 & 0xffffffffffff),
                                  &local_438->super_Ray,lambda);
              auVar77._0_8_ = SVar82.values.values._8_8_;
              auVar77._8_56_ = auVar80;
              auVar71 = auVar77._0_16_;
              auVar55._0_8_ = SVar82.values.values._0_8_;
              auVar55._8_56_ = auVar68;
              auVar38 = auVar55._0_16_;
            }
            else {
              auVar68 = ZEXT856(0);
              auVar80 = ZEXT856(0);
              SVar82 = PortalImageInfiniteLight::Le
                                 ((PortalImageInfiniteLight *)(uVar29 & 0xffffffffffff),
                                  &local_438->super_Ray,lambda);
              auVar78._0_8_ = SVar82.values.values._8_8_;
              auVar78._8_56_ = auVar80;
              auVar71 = auVar78._0_16_;
              auVar56._0_8_ = SVar82.values.values._0_8_;
              auVar56._8_56_ = auVar68;
              auVar38 = auVar56._0_16_;
            }
          }
          auVar38 = vmovlhps_avx(auVar38,auVar71);
          if (iVar34 == 0 || local_480 != 0) {
            auVar47._0_4_ = auVar38._0_4_ * (float)local_3f8._0_4_;
            auVar47._4_4_ = auVar38._4_4_ * (float)local_3f8._4_4_;
            auVar47._8_4_ = auVar38._8_4_ * fStack_3f0;
            auVar47._12_4_ = auVar38._12_4_ * fStack_3ec;
          }
          else {
            local_2e0.y = fStack_1ec;
            local_2e0.x = fStack_1f0;
            local_2f8._16_4_ = IStack_208.low;
            local_2f8._20_4_ = IStack_208.high;
            local_2f8._0_4_ = local_218.low;
            local_2f8._4_4_ = local_218.high;
            local_2f8._8_4_ = IStack_210.low;
            local_2f8._12_4_ = IStack_210.high;
            local_2e0.z = fStack_1e8;
            local_2d4[0].x = TStack_78.x;
            local_2d4[0].y = TStack_78.y;
            local_2d4[0].z = TStack_78.z;
            uVar3 = (pLVar35->
                    super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                    ).bits;
            uVar29 = (local_3c8->lightSampler).
                     super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                     .bits;
            pEVar32 = (ExhaustiveLightSampler *)(uVar29 & 0xffffffffffff);
            local_3a8._0_4_ = (undefined4)uVar3;
            local_3a8._4_4_ = (undefined4)(uVar3 >> 0x20);
            if (uVar29 < 0x3000000000000) {
              if ((uVar29 & 0x3000000000000) == 0x2000000000000) {
                fVar43 = PowerLightSampler::PDF
                                   ((PowerLightSampler *)pEVar32,(LightSampleContext *)local_2f8,
                                    (LightHandle *)local_3a8);
              }
              else {
                sVar4 = (pEVar32->lights).nStored;
                auVar71 = vcvtusi2ss_avx512f(in_XMM6,sVar4);
                fVar43 = (float)((uint)(sVar4 != 0) * (int)(1.0 / auVar71._0_4_));
              }
            }
            else if ((uVar29 & 0xfffe000000000000) == 0x2000000000000) {
              fVar43 = BVHLightSampler::PDF
                                 ((BVHLightSampler *)pEVar32,(LightSampleContext *)local_2f8,
                                  (LightHandle *)local_3a8);
            }
            else {
              fVar43 = ExhaustiveLightSampler::PDF
                                 (pEVar32,(LightSampleContext *)local_2f8,(LightHandle *)local_3a8);
            }
            uStack_270 = CONCAT44(fStack_1ec,fStack_1f0);
            IStack_278 = IStack_208;
            local_288 = local_218;
            IStack_280 = IStack_210;
            fStack_268 = fStack_1e8;
            fStack_25c = TStack_78.z;
            fStack_264 = TStack_78.x;
            fStack_260 = TStack_78.y;
            pVVar1 = &(local_438->super_Ray).d;
            auVar71._8_4_ = fStack_1e8;
            auVar71._0_8_ = uStack_270;
            auVar71._12_4_ = fStack_264;
            uStack_380._4_4_ = TStack_78.z;
            uStack_380._0_4_ = fStack_260;
            local_3c0 = local_3c0 & 0xffffffff00000000;
            local_3a8._16_4_ = IStack_208.low;
            local_3a8._20_4_ = IStack_208.high;
            stack0xfffffffffffffbe0 = local_328;
            local_428._0_8_ = local_3a8;
            local_418 = &local_3c0;
            local_3a8._0_4_ = local_218.low;
            local_3a8._4_4_ = local_218.high;
            local_3a8._8_4_ = IStack_210.low;
            local_3a8._12_4_ = IStack_210.high;
            local_3a8._24_4_ = fStack_1f0;
            local_3a8._28_4_ = fStack_1ec;
            TStack_388.bits = auVar71._8_8_;
            _local_328 = (undefined1  [12])pVVar1->super_Tuple3<pbrt::Vector3,_float>;
            uVar29 = (pLVar35->
                     super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                     ).bits;
            uVar27 = (uint)(ushort)(uVar29 >> 0x30);
            if (uVar29 < 0x5000000000000) {
              pLVar33 = (pointer)local_338._0_8_;
              fVar44 = 0.0;
              if (0x2ffffffffffff < uVar29) {
                if ((uVar27 & 6) == 2) {
                  auVar20._8_8_ = uStack_270;
                  auVar20._0_4_ = IStack_208.low;
                  auVar20._4_4_ = IStack_208.high;
                  auVar20._16_4_ = fStack_1e8;
                  auVar20._20_4_ = fStack_264;
                  auVar19._24_4_ = fStack_260;
                  auVar19._0_24_ = auVar20;
                  auVar19._28_4_ = TStack_78.z;
                  LVar8.pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y = IStack_210;
                  LVar8.pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x = local_218;
                  LVar8.pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z = IStack_208;
                  LVar8.n.super_Tuple3<pbrt::Normal3,_float>.x = fStack_1f0;
                  LVar8.n.super_Tuple3<pbrt::Normal3,_float>.y = fStack_1ec;
                  LVar8.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)(int)auVar20._16_8_;
                  LVar8.ns.super_Tuple3<pbrt::Normal3,_float>.x =
                       (float)(int)((ulong)auVar20._16_8_ >> 0x20);
                  LVar8.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)auVar19._24_8_;
                  LVar8.ns.super_Tuple3<pbrt::Normal3,_float>.z =
                       (float)(int)((ulong)auVar19._24_8_ >> 0x20);
                  fVar44 = ProjectionLight::PDF_Li
                                     ((ProjectionLight *)(uVar29 & 0xffffffffffff),LVar8,
                                      (Vector3f)pVVar1->super_Tuple3<pbrt::Vector3,_float>,WithMIS);
                }
                else {
                  auVar22._8_8_ = uStack_270;
                  auVar22._0_4_ = IStack_208.low;
                  auVar22._4_4_ = IStack_208.high;
                  auVar22._16_4_ = fStack_1e8;
                  auVar22._20_4_ = fStack_264;
                  auVar21._24_4_ = fStack_260;
                  auVar21._0_24_ = auVar22;
                  auVar21._28_4_ = TStack_78.z;
                  LVar9.pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y = IStack_210;
                  LVar9.pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x = local_218;
                  LVar9.pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z = IStack_208;
                  LVar9.n.super_Tuple3<pbrt::Normal3,_float>.x = fStack_1f0;
                  LVar9.n.super_Tuple3<pbrt::Normal3,_float>.y = fStack_1ec;
                  LVar9.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)(int)auVar22._16_8_;
                  LVar9.ns.super_Tuple3<pbrt::Normal3,_float>.x =
                       (float)(int)((ulong)auVar22._16_8_ >> 0x20);
                  LVar9.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)auVar21._24_8_;
                  LVar9.ns.super_Tuple3<pbrt::Normal3,_float>.z =
                       (float)(int)((ulong)auVar21._24_8_ >> 0x20);
                  fVar44 = GoniometricLight::PDF_Li
                                     ((GoniometricLight *)(uVar29 & 0xffffffffffff),LVar9,
                                      (Vector3f)pVVar1->super_Tuple3<pbrt::Vector3,_float>,WithMIS);
                }
              }
            }
            else {
              local_3b8.bits = uVar29;
              fVar44 = detail::DispatchSplit<5>::operator()
                                 ((DispatchSplit<5> *)local_42c,&local_3b8,uVar27 - 4);
              pLVar33 = (pointer)local_338._0_8_;
            }
            auVar71 = vfmadd231ss_fma(ZEXT416((uint)(fVar43 * fVar44 * fVar43 * fVar44)),
                                      ZEXT416((uint)local_47c),ZEXT416((uint)local_47c));
            fVar43 = (float)local_318._0_4_ / auVar71._0_4_;
            auVar47._0_4_ = fVar43 * (float)local_3f8._0_4_ * auVar38._0_4_;
            auVar47._4_4_ = fVar43 * (float)local_3f8._4_4_ * auVar38._4_4_;
            auVar47._8_4_ = fVar43 * fStack_3f0 * auVar38._8_4_;
            auVar47._12_4_ = fVar43 * fStack_3ec * auVar38._12_4_;
          }
          pLVar35 = pLVar35 + 1;
          auVar38 = *(undefined1 (*) [16])(lambda->pdf).values;
          uVar29 = vcmpps_avx512vl(auVar38,_DAT_004fb010,4);
          auVar38 = vdivps_avx512vl(auVar47,auVar38);
          local_3e8._0_4_ =
               (float)((uint)((byte)uVar29 & 1) * auVar38._0_4_) + (float)local_3e8._0_4_;
          local_3e8._4_4_ =
               (float)((uint)((byte)(uVar29 >> 1) & 1) * auVar38._4_4_) + (float)local_3e8._4_4_;
          fStack_3e0 = (float)((uint)((byte)(uVar29 >> 2) & 1) * auVar38._8_4_) + fStack_3e0;
          fStack_3dc = (float)((uint)((byte)(uVar29 >> 3) & 1) * auVar38._12_4_) + fStack_3dc;
        } while (pLVar35 != pLVar33);
        bVar37 = true;
        this = local_3c8;
        ray = local_438;
      }
    }
    else {
      PrimitiveHandle::Intersect
                ((optional<pbrt::ShapeIntersection> *)&local_1b8.__align,local_238,&ray->super_Ray,
                 INFINITY);
      if ((local_b8 & 1) == 0) goto LAB_0042c603;
      uVar29._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
      uVar29._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar38._0_8_ = uVar29 ^ 0x8000000080000000;
      auVar38._8_4_ = 0x80000000;
      auVar38._12_4_ = 0x80000000;
      auVar68 = ZEXT856(auVar38._8_8_);
      auVar70._0_4_ = -(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar70._4_4_ = 0x80000000;
      auVar70._8_4_ = 0x80000000;
      auVar70._12_4_ = 0x80000000;
      auVar80 = ZEXT856(auVar70._8_8_);
      uVar2 = vmovlps_avx(auVar38);
      local_3a8._0_4_ = (undefined4)uVar2;
      local_3a8._4_4_ = (undefined4)((ulong)uVar2 >> 0x20);
      local_3a8._8_4_ = auVar70._0_4_;
      SVar82 = SurfaceInteraction::Le
                         ((SurfaceInteraction *)&local_1b8.__align,(Vector3f *)local_3a8,lambda);
      auVar56 = local_1b8._192_64_;
      auVar75._0_8_ = SVar82.values.values._8_8_;
      auVar75._8_56_ = auVar80;
      auVar57._0_8_ = SVar82.values.values._0_8_;
      auVar57._8_56_ = auVar68;
      _local_328 = vmovlhps_avx(auVar57._0_16_,auVar75._0_16_);
      if ((SVar82.values.values[0] != 0.0) || (NAN(SVar82.values.values[0]))) {
LAB_0042c5b5:
        if ((iVar34 == 0) || (local_480 != 0)) {
          fVar43 = (float)local_3f8._0_4_;
          fVar44 = (float)local_3f8._4_4_;
          fVar67 = fStack_3f0;
          fVar45 = fStack_3ec;
        }
        else {
          if ((char)local_b8 == '\0') goto LAB_0042d8f6;
          uVar2 = local_1b8._200_8_;
          local_2e0.y = fStack_1ec;
          local_2e0.x = fStack_1f0;
          local_2f8._16_4_ = IStack_208.low;
          local_2f8._20_4_ = IStack_208.high;
          local_2f8._0_4_ = local_218.low;
          local_2f8._4_4_ = local_218.high;
          local_2f8._8_4_ = IStack_210.low;
          local_2f8._12_4_ = IStack_210.high;
          local_2e0.z = fStack_1e8;
          local_2d4[0].x = TStack_78.x;
          local_2d4[0].y = TStack_78.y;
          local_2d4[0].z = TStack_78.z;
          uVar29 = (this->lightSampler).
                   super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                   .bits;
          pEVar32 = (ExhaustiveLightSampler *)(uVar29 & 0xffffffffffff);
          local_3a8._0_4_ = local_1b8._200_4_;
          local_3a8._4_4_ = local_1b8._204_4_;
          if (uVar29 < 0x3000000000000) {
            if ((uVar29 & 0x3000000000000) == 0x2000000000000) {
              fVar43 = PowerLightSampler::PDF
                                 ((PowerLightSampler *)pEVar32,(LightSampleContext *)local_2f8,
                                  (LightHandle *)local_3a8);
            }
            else {
              sVar4 = (pEVar32->lights).nStored;
              auVar38 = vcvtusi2ss_avx512f(in_XMM6,sVar4);
              fVar43 = (float)((uint)(sVar4 != 0) * (int)(1.0 / auVar38._0_4_));
            }
          }
          else if ((uVar29 & 0xfffe000000000000) == 0x2000000000000) {
            fVar43 = BVHLightSampler::PDF
                               ((BVHLightSampler *)pEVar32,(LightSampleContext *)local_2f8,
                                (LightHandle *)local_3a8);
          }
          else {
            fVar43 = ExhaustiveLightSampler::PDF
                               (pEVar32,(LightSampleContext *)local_2f8,(LightHandle *)local_3a8);
          }
          uStack_2a0 = CONCAT44(fStack_1ec,fStack_1f0);
          IStack_2a8 = IStack_208;
          local_2b8 = local_218;
          IStack_2b0 = IStack_210;
          fStack_298 = fStack_1e8;
          fStack_28c = TStack_78.z;
          fStack_294 = TStack_78.x;
          fStack_290 = TStack_78.y;
          pVVar1 = &(ray->super_Ray).d;
          local_3b8.bits._0_4_ = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).x;
          local_3b8.bits._4_4_ = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).y;
          local_3b0 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
          TStack_388.bits._4_4_ = fStack_294;
          TStack_388.bits._0_4_ = fStack_1e8;
          uStack_380._4_4_ = TStack_78.z;
          uStack_380._0_4_ = fStack_290;
          local_42c = (undefined1  [4])0x0;
          local_3a8._16_4_ = IStack_208.low;
          local_3a8._20_4_ = IStack_208.high;
          stack0xfffffffffffffbe0 = &local_3b8;
          local_428._0_8_ = local_3a8;
          local_418 = (ulong *)local_42c;
          local_3a8._0_4_ = local_218.low;
          local_3a8._4_4_ = local_218.high;
          local_3a8._8_4_ = IStack_210.low;
          local_3a8._12_4_ = IStack_210.high;
          local_3a8._24_4_ = fStack_1f0;
          local_3a8._28_4_ = fStack_1ec;
          if ((ulong)uVar2 < 0x5000000000000) {
            fVar44 = 0.0;
            if (0x2ffffffffffff < (ulong)uVar2) {
              if ((auVar56._14_2_ & 6) == 2) {
                LVar10.ns.super_Tuple3<pbrt::Normal3,_float>.x = fStack_294;
                LVar10.n.super_Tuple3<pbrt::Normal3,_float>.z = fStack_1e8;
                LVar10.ns.super_Tuple3<pbrt::Normal3,_float>.z = TStack_78.z;
                LVar10.ns.super_Tuple3<pbrt::Normal3,_float>.y = fStack_290;
                LVar10.pi.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y = IStack_210;
                LVar10.pi.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x = local_218;
                LVar10.pi.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z = IStack_208;
                LVar10.n.super_Tuple3<pbrt::Normal3,_float>.x = fStack_1f0;
                LVar10.n.super_Tuple3<pbrt::Normal3,_float>.y = fStack_1ec;
                fVar44 = ProjectionLight::PDF_Li
                                   ((ProjectionLight *)(uVar2 & 0xffffffffffff),LVar10,
                                    (Vector3f)pVVar1->super_Tuple3<pbrt::Vector3,_float>,WithMIS);
              }
              else {
                LVar11.ns.super_Tuple3<pbrt::Normal3,_float>.x = fStack_294;
                LVar11.n.super_Tuple3<pbrt::Normal3,_float>.z = fStack_1e8;
                LVar11.ns.super_Tuple3<pbrt::Normal3,_float>.z = TStack_78.z;
                LVar11.ns.super_Tuple3<pbrt::Normal3,_float>.y = fStack_290;
                LVar11.pi.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y = IStack_210;
                LVar11.pi.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x = local_218;
                LVar11.pi.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z = IStack_208;
                LVar11.n.super_Tuple3<pbrt::Normal3,_float>.x = fStack_1f0;
                LVar11.n.super_Tuple3<pbrt::Normal3,_float>.y = fStack_1ec;
                fVar44 = GoniometricLight::PDF_Li
                                   ((GoniometricLight *)(uVar2 & 0xffffffffffff),LVar11,
                                    (Vector3f)pVVar1->super_Tuple3<pbrt::Vector3,_float>,WithMIS);
              }
            }
          }
          else {
            local_3c0 = uVar2;
            fVar44 = detail::DispatchSplit<5>::operator()(&local_439,&local_3c0,auVar56._14_2_ - 4);
          }
          auVar38 = vfmadd231ss_fma(ZEXT416((uint)(fVar43 * fVar44 * fVar43 * fVar44)),
                                    ZEXT416((uint)local_47c),ZEXT416((uint)local_47c));
          fVar45 = (local_47c * local_47c) / auVar38._0_4_;
          fVar43 = fVar45 * (float)local_3f8._0_4_;
          fVar44 = fVar45 * (float)local_3f8._4_4_;
          fVar67 = fVar45 * fStack_3f0;
          fVar45 = fVar45 * fStack_3ec;
        }
        auVar48._0_4_ = fVar43 * (float)local_328;
        auVar48._4_4_ = fVar44 * afStack_324[0];
        auVar48._8_4_ = fVar67 * afStack_324[1];
        auVar48._12_4_ = fVar45 * afStack_324[2];
        auVar38 = *(undefined1 (*) [16])(lambda->pdf).values;
        uVar29 = vcmpps_avx512vl(auVar38,_DAT_004fb010,4);
        auVar38 = vdivps_avx512vl(auVar48,auVar38);
        fVar43 = (float)((uint)((byte)uVar29 & 1) * auVar38._0_4_);
        fVar44 = (float)((uint)((byte)(uVar29 >> 1) & 1) * auVar38._4_4_);
        auVar39._4_4_ = fVar44;
        auVar39._0_4_ = fVar43;
        fVar67 = (float)((uint)((byte)(uVar29 >> 2) & 1) * auVar38._8_4_);
        auVar39._8_4_ = fVar67;
        fVar45 = (float)((uint)((byte)(uVar29 >> 3) & 1) * auVar38._12_4_);
        auVar39._12_4_ = fVar45;
        uVar36 = auVar39._8_8_;
        local_3e8._0_4_ = fVar43 + (float)local_3e8._0_4_;
        local_3e8._4_4_ = fVar44 + (float)local_3e8._4_4_;
        fStack_3e0 = fVar67 + fStack_3e0;
        fStack_3dc = fVar45 + fStack_3dc;
      }
      else {
        uVar29 = 0xffffffffffffffff;
        do {
          uVar36 = auVar57._8_8_;
          if (uVar29 == 2) goto LAB_0042cef0;
          fVar43 = *(float *)(local_328 + uVar29 * 4 + 8);
          auVar57 = ZEXT464((uint)fVar43);
          uVar36 = 0;
          uVar29 = uVar29 + 1;
        } while ((fVar43 == 0.0) && (!NAN(fVar43)));
        if (uVar29 < 3) goto LAB_0042c5b5;
      }
LAB_0042cef0:
      if ((char)local_b8 == '\0') {
LAB_0042d8f6:
        LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
      }
      local_220.bits =
           (this->super_RayIntegrator).super_ImageTileIntegrator.camera.
           super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
           .bits;
      local_228.
      super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
      .bits = (TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
               )(local_3d0->
                super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                ).bits;
      SurfaceInteraction::GetBSDF
                ((BSDF *)local_2f8,(SurfaceInteraction *)&local_1b8.__align,ray,lambda,
                 (CameraHandle *)&local_220,local_240,&local_228);
      if ((local_2f8._8_8_ & 0xffffffffffff) == 0) {
        if ((char)local_b8 == '\0') goto LAB_0042d8f6;
        SurfaceInteraction::SkipIntersection
                  ((SurfaceInteraction *)&local_1b8.__align,ray,(Float)local_1b8._248_4_);
        bVar37 = false;
      }
      else {
        uVar29 = 0;
        if (iVar34 == 0 && local_300 != (VisibleSurface *)0x0) {
          uVar36 = 0;
          _local_468 = ZEXT816(0);
          do {
            fVar43 = 1.0;
            uVar36 = uVar36 + 1;
            lVar31 = 0;
            uVar29 = uVar36;
            do {
              fVar43 = fVar43 * 0.5;
              lVar31 = (lVar31 - uVar29 / 2) * 2 + uVar29;
              bVar37 = 1 < uVar29;
              uVar29 = uVar29 / 2;
            } while (bVar37);
            auVar38 = vcvtusi2ss_avx512f(in_XMM6,lVar31);
            lVar31 = 0;
            fVar44 = 1.0;
            uVar29 = uVar36;
            do {
              fVar44 = fVar44 * 0.33333334;
              lVar31 = (lVar31 - uVar29 / 3) * 3 + uVar29;
              bVar37 = 2 < uVar29;
              uVar29 = uVar29 / 3;
            } while (bVar37);
            auVar71 = vcvtusi2ss_avx512f(in_XMM6,lVar31);
            lVar31 = 0;
            fVar67 = 1.0;
            uVar29 = uVar36;
            do {
              fVar67 = local_430 * fVar67;
              lVar31 = (lVar31 - uVar29 / 5) * 5 + uVar29;
              bVar37 = 4 < uVar29;
              uVar29 = uVar29 / 5;
            } while (bVar37);
            auVar47 = vcvtusi2ss_avx512f(in_XMM6,lVar31);
            auVar70 = SUB6416(ZEXT464(0x3f7fffff),0);
            auVar71 = vminss_avx(auVar70,ZEXT416((uint)(fVar44 * auVar71._0_4_)));
            auVar47 = vminss_avx(auVar70,ZEXT416((uint)(fVar67 * auVar47._0_4_)));
            local_428._4_4_ = auVar47._0_4_;
            local_428._0_4_ = auVar71._0_4_;
            if ((char)local_b8 == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
            }
            auVar38 = vminss_avx(auVar70,ZEXT416((uint)(fVar43 * auVar38._0_4_)));
            BSDF::Sample_f((BSDFSample *)local_3a8,(BSDF *)local_2f8,(Vector3f)local_1b8._28_12_,
                           auVar38._0_4_,(Point2f *)local_428,Radiance,All);
            if (0.0 < (float)local_3a8._28_4_) {
              if ((char)local_b8 == '\0') {
                LogFatal<char_const(&)[4]>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                           ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
              }
              auVar49._4_4_ = local_3a8._28_4_;
              auVar49._0_4_ = local_3a8._28_4_;
              auVar49._8_4_ = local_3a8._28_4_;
              auVar49._12_4_ = local_3a8._28_4_;
              auVar38 = vfmadd132ss_fma(ZEXT416((uint)local_1b8._132_4_),
                                        ZEXT416((uint)((float)local_1b8._136_4_ *
                                                      (float)local_3a8._24_4_)),
                                        ZEXT416((uint)local_3a8._20_4_));
              auVar71 = vfmsub213ss_fma(ZEXT416((uint)local_3a8._24_4_),
                                        ZEXT416((uint)local_1b8._136_4_),
                                        ZEXT416((uint)((float)local_1b8._136_4_ *
                                                      (float)local_3a8._24_4_)));
              auVar38 = vfmadd231ss_fma(ZEXT416((uint)(auVar38._0_4_ + auVar71._0_4_)),
                                        ZEXT416((uint)local_1b8._128_4_),
                                        ZEXT416((uint)local_3a8._16_4_));
              uVar69 = auVar38._0_4_;
              auVar72._4_4_ = uVar69;
              auVar72._0_4_ = uVar69;
              auVar72._8_4_ = uVar69;
              auVar72._12_4_ = uVar69;
              auVar5._8_4_ = 0x7fffffff;
              auVar5._0_8_ = 0x7fffffff7fffffff;
              auVar5._12_4_ = 0x7fffffff;
              auVar38 = vandps_avx512vl(auVar72,auVar5);
              auVar73._0_4_ = auVar38._0_4_ * (float)local_3a8._0_4_;
              auVar73._4_4_ = auVar38._4_4_ * (float)local_3a8._4_4_;
              auVar73._8_4_ = auVar38._8_4_ * (float)local_3a8._8_4_;
              auVar73._12_4_ = auVar38._12_4_ * (float)local_3a8._12_4_;
              auVar38 = vdivps_avx(auVar73,auVar49);
              local_468._4_4_ = auVar38._4_4_ + (float)local_468._4_4_;
              local_468._0_4_ = auVar38._0_4_ + (float)local_468._0_4_;
              fStack_460 = auVar38._8_4_ + fStack_460;
              fStack_45c = auVar38._12_4_ + fStack_45c;
            }
            uVar29 = 0;
          } while (uVar36 != 0x10);
          auVar6._8_4_ = 0x3d800000;
          auVar6._0_8_ = 0x3d8000003d800000;
          auVar6._12_4_ = 0x3d800000;
          _local_428 = (array<float,_4>)vmulps_avx512vl(_local_468,auVar6);
          if ((char)local_b8 == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
          }
          VisibleSurface::VisibleSurface
                    ((VisibleSurface *)local_3a8,(SurfaceInteraction *)&local_1b8.__align,
                     (CameraTransform *)
                     ((this->super_RayIntegrator).super_ImageTileIntegrator.camera.
                      super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                      .bits & 0xffffffffffff),(SampledSpectrum *)local_428,lambda);
          (local_300->albedo).values.values[3] = fStack_368;
          auVar18._4_4_ = local_3a8._4_4_;
          auVar18._0_4_ = local_3a8._0_4_;
          auVar18._8_4_ = local_3a8._8_4_;
          auVar18._12_4_ = local_3a8._12_4_;
          uVar13 = local_3a8._16_4_;
          auVar12 = auVar18;
          auVar83._16_4_ = uVar13;
          auVar83._0_16_ = auVar12;
          uVar14 = local_3a8._20_4_;
          auVar83._20_4_ = uVar14;
          uVar15 = local_3a8._24_4_;
          auVar83._24_4_ = uVar15;
          uVar16 = local_3a8._28_4_;
          auVar84._28_4_ = uVar16;
          auVar84._0_28_ = auVar83;
          uVar17 = TStack_388.bits;
          auVar84._32_8_ = uVar17;
          uVar85._0_1_ = uStack_380._0_1_;
          uVar85._1_3_ = uStack_380._1_3_;
          uVar85._4_4_ = uStack_380._4_4_;
          uVar36 = auVar18._8_8_;
          local_300->set = (bool)(char)local_3a8._0_4_;
          *(int3 *)&local_300->field_0x1 = SUB43(local_3a8._0_4_,1);
          local_300->p = (Point3f)auVar18._4_12_;
          local_300->n = (Normal3f)auVar83._16_12_;
          local_300->ns = (Normal3f)auVar84._28_12_;
          local_300->time = (Float)(int)uVar85;
          local_300->dzdx = uStack_380._4_4_;
          local_300->dzdy = fStack_378;
          (local_300->albedo).values.values[0] = fStack_374;
          (local_300->albedo).values.values[1] = fStack_370;
          (local_300->albedo).values.values[2] = fStack_36c;
        }
        iVar26 = iVar34 + 1;
        bVar37 = true;
        if (iVar34 != this->maxDepth) {
          if ((this->regularize & (byte)local_340) == 1) {
            *(long *)(in_FS_OFFSET + -0x2c8) = *(long *)(in_FS_OFFSET + -0x2c8) + 1;
            BSDF::Regularize((BSDF *)local_2f8);
          }
          *(long *)(in_FS_OFFSET + -0x2c0) = *(long *)(in_FS_OFFSET + -0x2c0) + 1;
          auVar68 = ZEXT856(uVar36);
          auVar80 = ZEXT856(uVar29);
          bVar37 = BSDF::IsNonSpecular((BSDF *)local_2f8);
          if (bVar37) {
            *(long *)(in_FS_OFFSET + -0x2b8) = *(long *)(in_FS_OFFSET + -0x2b8) + 1;
            local_230.
            super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
            .bits = (TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                     )(local_3d0->
                      super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                      ).bits;
            SVar82 = SampleLd(this,(SurfaceInteraction *)&local_1b8.__align,(BSDF *)local_2f8,lambda
                              ,&local_230);
            auVar79._0_8_ = SVar82.values.values._8_8_;
            auVar79._8_56_ = auVar80;
            auVar58._0_8_ = SVar82.values.values._0_8_;
            auVar58._8_56_ = auVar68;
            auVar38 = vmovlhps_avx(auVar58._0_16_,auVar79._0_16_);
            local_3a8._0_4_ = auVar38._0_4_;
            local_3a8._4_4_ = auVar38._4_4_;
            local_3a8._8_4_ = auVar38._8_4_;
            local_3a8._12_4_ = auVar38._12_4_;
            if ((SVar82.values.values[0] == 0.0) && (!NAN(SVar82.values.values[0]))) {
              uVar29 = 0xffffffffffffffff;
              do {
                if (uVar29 == 2) goto LAB_0042d324;
                lVar31 = uVar29 * 4;
                uVar29 = uVar29 + 1;
              } while ((*(float *)(local_3a8 + lVar31 + 8) == 0.0) &&
                      (!NAN(*(float *)(local_3a8 + lVar31 + 8))));
              if (2 < uVar29) {
LAB_0042d324:
                *(long *)(in_FS_OFFSET + -0x2b0) = *(long *)(in_FS_OFFSET + -0x2b0) + 1;
              }
            }
            auVar50._0_4_ = (float)local_3f8._0_4_ * (float)local_3a8._0_4_;
            auVar50._4_4_ = (float)local_3f8._4_4_ * (float)local_3a8._4_4_;
            auVar50._8_4_ = fStack_3f0 * (float)local_3a8._8_4_;
            auVar50._12_4_ = fStack_3ec * (float)local_3a8._12_4_;
            auVar38 = *(undefined1 (*) [16])(lambda->pdf).values;
            uVar29 = vcmpps_avx512vl(auVar38,_DAT_004fb010,4);
            auVar38 = vdivps_avx512vl(auVar50,auVar38);
            local_3e8._4_4_ =
                 (float)((uint)((byte)(uVar29 >> 1) & 1) * auVar38._4_4_) + (float)local_3e8._4_4_;
            local_3e8._0_4_ =
                 (float)((uint)((byte)uVar29 & 1) * auVar38._0_4_) + (float)local_3e8._0_4_;
            fStack_3e0 = (float)((uint)((byte)(uVar29 >> 2) & 1) * auVar38._8_4_) + fStack_3e0;
            fStack_3dc = (float)((uint)((byte)(uVar29 >> 3) & 1) * auVar38._12_4_) + fStack_3dc;
          }
          pSVar25 = local_3d0;
          uVar36._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
          uVar36._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
          uVar29 = (local_3d0->
                   super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                   ).bits;
          local_3a8._0_4_ = (undefined4)uVar29;
          local_3a8._4_4_ = (undefined4)(uVar29 >> 0x20);
          local_338 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z);
          FVar46 = detail::DispatchSplit<8>::operator()
                             ((DispatchSplit<8> *)local_428,local_3a8,uVar29 >> 0x30);
          uVar29 = (pSVar25->
                   super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                   ).bits;
          local_318._0_4_ = FVar46;
          uVar27 = (uint)(ushort)(uVar29 >> 0x30);
          if (uVar29 < 0x5000000000000) {
            if (uVar29 < 0x3000000000000) {
              if (uVar27 == 2) {
                auVar59._0_8_ =
                     PaddedSobolSampler::Get2D((PaddedSobolSampler *)(uVar29 & 0xffffffffffff));
                auVar59._8_56_ = extraout_var_00;
                auVar38 = auVar59._0_16_;
              }
              else {
                auVar63._0_8_ = HaltonSampler::Get2D((HaltonSampler *)(uVar29 & 0xffffffffffff));
                auVar63._8_56_ = extraout_var_04;
                auVar38 = auVar63._0_16_;
              }
            }
            else if ((uVar27 & 6) == 2) {
              auVar61._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)(uVar29 & 0xffffffffffff));
              auVar61._8_56_ = extraout_var_02;
              auVar38 = auVar61._0_16_;
            }
            else {
              auVar65._0_8_ = RandomSampler::Get2D((RandomSampler *)(uVar29 & 0xffffffffffff));
              auVar65._8_56_ = extraout_var_06;
              auVar38 = auVar65._0_16_;
            }
          }
          else {
            uVar27 = uVar27 - 4;
            if (uVar27 < 3) {
              if (uVar27 == 2) {
                auVar60._0_8_ =
                     StratifiedSampler::Get2D((StratifiedSampler *)(uVar29 & 0xffffffffffff));
                auVar60._8_56_ = extraout_var_01;
                auVar38 = auVar60._0_16_;
              }
              else {
                auVar64._0_8_ = SobolSampler::Get2D((SobolSampler *)(uVar29 & 0xffffffffffff));
                auVar64._8_56_ = extraout_var_05;
                auVar38 = auVar64._0_16_;
              }
            }
            else {
              this_00 = (DebugMLTSampler *)(uVar29 & 0xffffffffffff);
              if ((uVar27 & 0x7ffffffe) == 2) {
                auVar62._0_8_ = MLTSampler::Get2D((MLTSampler *)this_00);
                auVar62._8_56_ = extraout_var_03;
                auVar38 = auVar62._0_16_;
              }
              else {
                local_258 = SUB84(this_00,0);
                fStack_254 = (float)((ulong)this_00 >> 0x20);
                local_1c8 = DebugMLTSampler::Get1D(this_00);
                uStack_1c4 = extraout_XMM0_Db;
                uStack_1c0 = extraout_XMM0_Dc;
                uStack_1bc = extraout_XMM0_Dd;
                auVar66._0_4_ =
                     DebugMLTSampler::Get1D((DebugMLTSampler *)CONCAT44(fStack_254,local_258));
                auVar66._4_60_ = extraout_var;
                auVar24._4_4_ = uStack_1c4;
                auVar24._0_4_ = local_1c8;
                auVar24._8_4_ = uStack_1c0;
                auVar24._12_4_ = uStack_1bc;
                auVar38 = vinsertps_avx(auVar24,auVar66._0_16_,0x10);
              }
            }
          }
          uVar2 = vmovlps_avx(auVar38);
          local_3a8._0_4_ = (undefined4)uVar2;
          local_3a8._4_4_ = (undefined4)((ulong)uVar2 >> 0x20);
          uVar36 = uVar36 ^ 0x8000000080000000;
          woRender.super_Tuple3<pbrt::Vector3,_float>.z = -local_338._0_4_;
          auVar74._0_8_ = local_338._0_8_ ^ 0x8000000080000000;
          auVar74._8_4_ = local_338._8_4_ ^ 0x80000000;
          auVar74._12_4_ = local_338._12_4_ ^ 0x80000000;
          woRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar36;
          woRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(uVar36 >> 0x20);
          local_338 = auVar74;
          BSDF::Sample_f((BSDFSample *)local_428,(BSDF *)local_2f8,woRender,(Float)local_318._0_4_,
                         (Point2f *)local_3a8,Radiance,All);
          bVar37 = true;
          if (0.0 < local_40c) {
            local_47c = local_40c;
            local_318 = ZEXT416((uint)local_40c);
            auVar38 = vfmadd132ss_fma(ZEXT416((uint)local_1b8._132_4_),
                                      ZEXT416((uint)((float)local_1b8._136_4_ * local_410)),
                                      ZEXT416((uint)local_418._4_4_));
            auVar71 = vfmsub213ss_fma(ZEXT416((uint)local_1b8._136_4_),ZEXT416((uint)local_410),
                                      ZEXT416((uint)((float)local_1b8._136_4_ * local_410)));
            auVar38 = vfmadd231ss_fma(ZEXT416((uint)(auVar38._0_4_ + auVar71._0_4_)),
                                      ZEXT416((uint)local_1b8._128_4_),
                                      ZEXT416((uint)(float)local_418));
            uVar69 = auVar38._0_4_;
            auVar51._4_4_ = uVar69;
            auVar51._0_4_ = uVar69;
            auVar51._8_4_ = uVar69;
            auVar51._12_4_ = uVar69;
            auVar7._8_4_ = 0x7fffffff;
            auVar7._0_8_ = 0x7fffffff7fffffff;
            auVar7._12_4_ = 0x7fffffff;
            auVar38 = vandps_avx512vl(auVar51,auVar7);
            local_258 = auVar38._0_4_ * (float)local_428._0_4_;
            fStack_254 = auVar38._4_4_ * (float)local_428._4_4_;
            fStack_250 = auVar38._8_4_ * (float)local_428._8_4_;
            fStack_24c = auVar38._12_4_ * fStack_41c;
            if ((ushort)local_2f8._14_2_ - 3 < 2) {
              woRender_00.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_338._0_4_;
              woRender_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar36;
              woRender_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(uVar36 >> 0x20);
              wiRender.super_Tuple3<pbrt::Vector3,_float>.z = local_410;
              wiRender.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_418;
              local_47c = BSDF::PDF((BSDF *)local_2f8,woRender_00,wiRender,Radiance,All);
            }
            auVar56 = local_1b8._0_64_;
            BVar28 = local_408 & Specular;
            bVar37 = (local_408 & Transmission) == Unset;
            if ((char)local_b8 == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
            }
            uVar69 = local_2f8._0_4_;
            local_218 = (Interval<float>)local_1b8.__align;
            IStack_210.low = (float)local_1b8._8_4_;
            IStack_210.high = (float)local_1b8._12_4_;
            IStack_208.low = (float)local_1b8._16_4_;
            IStack_208.high = (float)local_1b8._20_4_;
            uStack_200 = auVar56._24_4_;
            uStack_1fc = auVar56._28_4_;
            uStack_1f8 = auVar56._32_4_;
            uStack_1f4 = auVar56._36_4_;
            fStack_1f0 = auVar56._40_4_;
            fStack_1ec = auVar56._44_4_;
            fStack_1e8 = auVar56._48_4_;
            uStack_1e4 = auVar56._52_4_;
            uStack_1e0 = auVar56._56_4_;
            uStack_1dc = auVar56._60_4_;
            auVar42 = local_1b8._144_48_;
            local_a8._0_8_ = local_1b8._80_8_;
            local_a8._8_8_ = local_1b8._88_8_;
            uStack_98 = local_1b8._96_8_;
            uStack_90 = local_1b8._104_8_;
            uStack_88 = local_1b8._112_8_;
            uStack_80 = local_1b8._120_8_;
            TStack_78._0_8_ = local_1b8._128_8_;
            TStack_78.z = local_1b8._136_4_;
            uStack_6c = local_1b8._140_4_;
            local_1b8._0_64_ = auVar56;
            auStack_68 = auVar42;
            SurfaceInteraction::SpawnRay
                      ((RayDifferential *)local_3a8,(SurfaceInteraction *)&local_1b8.__align,ray,
                       (BSDF *)local_2f8,(Vector3f *)&local_418,local_408);
            this = local_3c8;
            auVar52._4_4_ = local_318._0_4_;
            auVar52._0_4_ = local_318._0_4_;
            auVar52._8_4_ = local_318._0_4_;
            auVar52._12_4_ = local_318._0_4_;
            auVar23._4_4_ = fStack_254;
            auVar23._0_4_ = local_258;
            auVar23._8_4_ = fStack_250;
            auVar23._12_4_ = fStack_24c;
            local_480 = BVar28 >> 4;
            local_340 = CONCAT71((int7)((ulong)local_340 >> 8),(byte)local_340 | BVar28 == Unset);
            auVar38 = vdivps_avx(auVar23,auVar52);
            local_3f8._0_4_ = auVar38._0_4_ * (float)local_3f8._0_4_;
            local_3f8._4_4_ = auVar38._4_4_ * (float)local_3f8._4_4_;
            fStack_3f0 = auVar38._8_4_ * fStack_3f0;
            fStack_3ec = auVar38._12_4_ * fStack_3ec;
            fVar43 = (float)local_1d8._0_4_ * (float)uVar69 * (float)uVar69;
            auVar41._16_48_ = auVar42;
            auVar41._0_16_ = ZEXT416((uint)fVar43);
            auVar40._4_60_ = auVar41._4_60_;
            auVar40._0_4_ = (float)((uint)bVar37 * local_1d8._0_4_ + (uint)!bVar37 * (int)fVar43);
            local_1d8 = auVar40._0_16_;
            (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_3a8._12_4_;
            (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_3a8._16_4_;
            *(ulong *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z =
                 CONCAT44(local_3a8._24_4_,local_3a8._20_4_);
            (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)local_3a8._0_4_;
            (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y = (float)local_3a8._4_4_;
            *(ulong *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
                 CONCAT44(local_3a8._12_4_,local_3a8._8_4_);
            (ray->super_Ray).medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits = TStack_388.bits;
            *(ulong *)(local_248 + 0x14) = CONCAT44(fStack_368,fStack_36c);
            (((Vector3f *)(local_248 + 0x1c))->super_Tuple3<pbrt::Vector3,_float>).x = fStack_364;
            (((Vector3f *)(local_248 + 0x1c))->super_Tuple3<pbrt::Vector3,_float>).y = fStack_360;
            *(undefined8 *)(local_248 + 0x24) = uStack_35c;
            *(undefined8 *)(local_248 + 0x2c) = uStack_354;
            *(undefined8 *)local_248 = uStack_380;
            *(undefined8 *)(local_248 + 8) = _fStack_378;
            (((Point3f *)(local_248 + 0x10))->super_Tuple3<pbrt::Point3,_float>).x = fStack_370;
            (((Point3f *)(local_248 + 0x10))->super_Tuple3<pbrt::Point3,_float>).y = fStack_36c;
            *(ulong *)(local_248 + 0x18) = CONCAT44(fStack_364,fStack_368);
            lVar31 = 1;
            auVar81._0_4_ = auVar40._0_4_ * (float)local_3f8._0_4_;
            auVar81._4_4_ = auVar40._0_4_ * (float)local_3f8._4_4_;
            auVar81._8_4_ = auVar40._0_4_ * fStack_3f0;
            auVar81._12_4_ = auVar40._0_4_ * fStack_3ec;
            local_3a8._4_4_ = auVar81._4_4_;
            local_3a8._8_4_ = auVar81._8_4_;
            local_3a8._12_4_ = auVar81._12_4_;
            auVar38 = auVar81;
            do {
              lVar30 = lVar31 * 4;
              lVar31 = lVar31 + 1;
              auVar38 = vmaxss_avx(ZEXT416(*(uint *)(local_3a8 + lVar30)),auVar38);
            } while (lVar31 != 4);
            local_3a8._0_4_ = auVar81._0_4_;
            if (0 < iVar34 && auVar38._0_4_ < local_3c8->rrThreshold) {
              lVar31 = 1;
              auVar38 = auVar81;
              do {
                lVar30 = lVar31 * 4;
                lVar31 = lVar31 + 1;
                auVar38 = vmaxss_avx(ZEXT416(*(uint *)(local_3a8 + lVar30)),auVar38);
              } while (lVar31 != 4);
              local_3b8.bits =
                   (local_3d0->
                   super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                   ).bits;
              FVar46 = detail::DispatchSplit<8>::operator()
                                 ((DispatchSplit<8> *)&local_3c0,&local_3b8,local_3b8.bits >> 0x30);
              bVar37 = true;
              local_478 = auVar38._0_4_;
              auVar38 = vmaxss_avx(ZEXT416((uint)(1.0 - local_478)),ZEXT416(0));
              if (FVar46 < auVar38._0_4_) goto LAB_0042d83c;
              fVar43 = 1.0 - auVar38._0_4_;
              auVar53._4_4_ = fVar43;
              auVar53._0_4_ = fVar43;
              auVar53._8_4_ = fVar43;
              auVar53._12_4_ = fVar43;
              _local_3f8 = vdivps_avx(_local_3f8,auVar53);
            }
            bVar37 = false;
          }
        }
      }
    }
LAB_0042d83c:
    iVar34 = iVar26;
    if (bVar37) {
      lVar31 = (long)iVar34;
      *(long *)(in_FS_OFFSET + -0x2a0) = *(long *)(in_FS_OFFSET + -0x2a0) + 1;
      *(long *)(in_FS_OFFSET + -0x2a8) = *(long *)(in_FS_OFFSET + -0x2a8) + lVar31;
      lVar30 = *(long *)(in_FS_OFFSET + -0x720);
      if (lVar31 <= *(long *)(in_FS_OFFSET + -0x720)) {
        lVar30 = lVar31;
      }
      if (lVar31 < *(long *)(in_FS_OFFSET + -0x718)) {
        lVar31 = *(long *)(in_FS_OFFSET + -0x718);
      }
      *(long *)(in_FS_OFFSET + -0x720) = lVar30;
      *(long *)(in_FS_OFFSET + -0x718) = lVar31;
      auVar38 = vshufpd_avx(_local_3e8,_local_3e8,1);
      SVar82.values.values._0_8_ = local_3e8;
      SVar82.values.values._8_8_ = auVar38._0_8_;
      return (SampledSpectrum)SVar82.values.values;
    }
  } while( true );
}

Assistant:

SampledSpectrum PathIntegrator::Li(RayDifferential ray, SampledWavelengths &lambda,
                                   SamplerHandle sampler, ScratchBuffer &scratchBuffer,
                                   VisibleSurface *visibleSurface) const {
    SampledSpectrum L(0.f), beta(1.f);
    bool specularBounce = false, anyNonSpecularBounces = false;
    int depth = 0;
    Float etaScale = 1, bsdfPDF;
    SurfaceInteraction prevIntr;

    while (true) {
        // Find next path vertex and accumulate contribution
        pstd::optional<ShapeIntersection> si = Intersect(ray);
        // Add emitted light at path vertex or from the environment
        if (!si) {
            // Incorporate emission from infinite lights for escaped ray
            for (const auto &light : infiniteLights) {
                SampledSpectrum Le = light.Le(ray, lambda);
                if (depth == 0 || specularBounce)
                    L += SafeDiv(beta * Le, lambda.PDF());
                else {
                    // Compute MIS weight for infinite light
                    Float lightPDF =
                        lightSampler.PDF(prevIntr, light) *
                        light.PDF_Li(prevIntr, ray.d, LightSamplingMode::WithMIS);
                    Float weight = PowerHeuristic(1, bsdfPDF, 1, lightPDF);

                    L += SafeDiv(beta * weight * Le, lambda.PDF());
                }
            }

            break;
        }
        // Incorporate emission from emissive surface hit by ray
        SampledSpectrum Le = si->intr.Le(-ray.d, lambda);
        if (Le) {
            if (depth == 0 || specularBounce)
                L += SafeDiv(beta * Le, lambda.PDF());
            else {
                // Compute MIS weight for area light
                LightHandle areaLight(si->intr.areaLight);
                Float lightPDF =
                    lightSampler.PDF(prevIntr, areaLight) *
                    areaLight.PDF_Li(prevIntr, ray.d, LightSamplingMode::WithMIS);
                Float weight = PowerHeuristic(1, bsdfPDF, 1, lightPDF);

                L += SafeDiv(beta * weight * Le, lambda.PDF());
            }
        }

        SurfaceInteraction &isect = si->intr;

        // Compute scattering functions and skip over medium boundaries
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf) {
            isect.SkipIntersection(&ray, si->tHit);
            continue;
        }

        // Initialize _visibleSurface_ at first intersection
        if (depth == 0 && visibleSurface != nullptr) {
            // Estimate BSDF's albedo
            constexpr int nRhoSamples = 16;
            SampledSpectrum rho(0.f);
            for (int i = 0; i < nRhoSamples; ++i) {
                // Generate sample for hemispherical-directional reflectance
                Float uc = RadicalInverse(0, i + 1);
                Point2f u(RadicalInverse(1, i + 1), RadicalInverse(2, i + 1));

                // Estimate one term of $\rho_\roman{hd}$
                auto bs = bsdf.Sample_f(si->intr.wo, uc, u);
                if (bs && bs.pdf > 0)
                    rho += bs.f * AbsDot(bs.wi, si->intr.shading.n) / bs.pdf;
            }
            SampledSpectrum albedo = rho / nRhoSamples;

            *visibleSurface =
                VisibleSurface(si->intr, camera.GetCameraTransform(), albedo, lambda);
        }

        // End path if maximum depth reached
        if (depth++ == maxDepth)
            break;

        // Possibly regularize the BSDF
        if (regularize && anyNonSpecularBounces) {
            ++regularizedBSDFs;
            bsdf.Regularize();
        }

        ++totalBSDFs;
        // Sample direct illumination from the light sources
        if (bsdf.IsNonSpecular()) {
            ++totalPaths;
            SampledSpectrum Ld = SampleLd(isect, bsdf, lambda, sampler);
            if (!Ld)
                ++zeroRadiancePaths;
            L += SafeDiv(beta * Ld, lambda.PDF());
        }

        // Sample BSDF to get new path direction
        Vector3f wo = -ray.d;
        Float u = sampler.Get1D();
        BSDFSample bs = bsdf.Sample_f(wo, u, sampler.Get2D());
        if (!bs)
            break;
        // Update path state variables for after surface scattering
        beta *= bs.f * AbsDot(bs.wi, isect.shading.n) / bs.pdf;
        bsdfPDF = bsdf.SampledPDFIsProportional() ? bsdf.PDF(wo, bs.wi) : bs.pdf;
        DCHECK(!IsInf(beta.y(lambda)));
        specularBounce = bs.IsSpecular();
        anyNonSpecularBounces |= !bs.IsSpecular();
        if (bs.IsTransmission())
            etaScale *= Sqr(bsdf.eta);
        prevIntr = si->intr;

        ray = isect.SpawnRay(ray, bsdf, bs.wi, bs.flags);

        // Possibly terminate the path with Russian roulette
        SampledSpectrum rrBeta = beta * etaScale;
        if (rrBeta.MaxComponentValue() < rrThreshold && depth > 1) {
            Float q = std::max<Float>(0, 1 - rrBeta.MaxComponentValue());
            if (sampler.Get1D() < q)
                break;
            beta /= 1 - q;
            DCHECK(!IsInf(beta.y(lambda)));
        }
    }
    ReportValue(pathLength, depth);
    return L;
}